

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int dotlockLock(sqlite3_file *id,int eFileLock)

{
  int posixError;
  sqlite3_io_methods *__file;
  int iVar1;
  int iVar2;
  int *piVar3;
  
  __file = id[5].pMethods;
  if (*(char *)((long)&id[3].pMethods + 4) == '\0') {
    iVar2 = 0x1ff;
    iVar1 = (*aSyscall[0x12].pCurrent)();
    if (iVar1 < 0) {
      piVar3 = __errno_location();
      posixError = *piVar3;
      iVar1 = 5;
      if (posixError != 0x11) {
        iVar2 = sqliteErrorFromPosixError(posixError,iVar2);
        if (iVar2 != 5) {
          *(int *)&id[4].pMethods = posixError;
          iVar1 = iVar2;
        }
      }
    }
    else {
      *(char *)((long)&id[3].pMethods + 4) = (char)eFileLock;
    }
  }
  else {
    *(char *)((long)&id[3].pMethods + 4) = (char)eFileLock;
    utimes((char *)__file,(timeval *)0x0);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int dotlockLock(sqlite3_file *id, int eFileLock) {
  unixFile *pFile = (unixFile*)id;
  char *zLockFile = (char *)pFile->lockingContext;
  int rc = SQLITE_OK;


  /* If we have any lock, then the lock file already exists.  All we have
  ** to do is adjust our internal record of the lock level.
  */
  if( pFile->eFileLock > NO_LOCK ){
    pFile->eFileLock = eFileLock;
    /* Always update the timestamp on the old file */
#ifdef HAVE_UTIME
    utime(zLockFile, NULL);
#else
    utimes(zLockFile, NULL);
#endif
    return SQLITE_OK;
  }

  /* grab an exclusive lock */
  rc = osMkdir(zLockFile, 0777);
  if( rc<0 ){
    /* failed to open/create the lock directory */
    int tErrno = errno;
    if( EEXIST == tErrno ){
      rc = SQLITE_BUSY;
    } else {
      rc = sqliteErrorFromPosixError(tErrno, SQLITE_IOERR_LOCK);
      if( rc!=SQLITE_BUSY ){
        storeLastErrno(pFile, tErrno);
      }
    }
    return rc;
  }

  /* got it, set the type and return ok */
  pFile->eFileLock = eFileLock;
  return rc;
}